

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O0

void __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
Response::Response(Response *this,Response *response)

{
  size_t maximum_size;
  element_type *peVar1;
  allocator<char> local_19;
  Response *local_18;
  Response *response_local;
  Response *this_local;
  
  local_18 = response;
  response_local = this;
  maximum_size = asio::basic_streambuf<std::allocator<char>_>::max_size(&response->streambuf);
  std::allocator<char>::allocator();
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->streambuf,maximum_size,&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared>
  ::shared_ptr(&this->shared,&local_18->shared);
  std::
  weak_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>
  ::weak_ptr(&this->connection_weak,&local_18->connection_weak);
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->shared);
  this->http_version = &peVar1->http_version;
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->shared);
  this->status_code = &peVar1->status_code;
  peVar1 = std::
           __shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Response::Shared,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->shared);
  this->header = &peVar1->header;
  Content::Content(&this->content,&this->streambuf);
  return;
}

Assistant:

Response(const Response &response) noexcept
          : streambuf(response.streambuf.max_size()), shared(response.shared), connection_weak(response.connection_weak), http_version(shared->http_version), status_code(shared->status_code), header(shared->header), content(streambuf) {}